

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_gmatch(lua_State *L)

{
  uint uVar1;
  lua_CFunction in_RDI;
  GCfunc *fn;
  undefined1 uVar2;
  int in_stack_ffffffffffffffec;
  lua_State *in_stack_fffffffffffffff0;
  
  lj_lib_checkstr(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  lj_lib_checkstr(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x10) + 0x18;
  *(undefined8 *)(*(long *)(in_RDI + 0x18) + -8) = 0;
  uVar2 = 0x59;
  lua_pushcclosure(L,in_RDI,0);
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x18) + -8);
  *(undefined1 *)((ulong)uVar1 + 6) = uVar2;
  *(int *)((ulong)uVar1 + 0x10) = *(int *)(in_RDI + 8) + 0xec;
  return 1;
}

Assistant:

LJLIB_CF(string_gmatch)
{
  lj_lib_checkstr(L, 1);
  lj_lib_checkstr(L, 2);
  L->top = L->base+3;
  (L->top-1)->u64 = 0;
  lj_lib_pushcc(L, lj_cf_string_gmatch_aux, FF_string_gmatch_aux, 3);
  return 1;
}